

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void stbi__skip(stbi__context *s,int n)

{
  int iVar1;
  int in_ESI;
  long in_RDI;
  int blen;
  
  if (in_ESI != 0) {
    if (in_ESI < 0) {
      *(undefined8 *)(in_RDI + 0xc0) = *(undefined8 *)(in_RDI + 200);
    }
    else if ((*(long *)(in_RDI + 0x10) == 0) ||
            (iVar1 = (int)*(undefined8 *)(in_RDI + 200) - (int)*(undefined8 *)(in_RDI + 0xc0),
            in_ESI <= iVar1)) {
      *(long *)(in_RDI + 0xc0) = *(long *)(in_RDI + 0xc0) + (long)in_ESI;
    }
    else {
      *(undefined8 *)(in_RDI + 0xc0) = *(undefined8 *)(in_RDI + 200);
      (**(code **)(in_RDI + 0x18))(*(undefined8 *)(in_RDI + 0x28),in_ESI - iVar1);
    }
  }
  return;
}

Assistant:

static void stbi__skip(stbi__context *s, int n)
{
   if (n == 0) return;  // already there!
   if (n < 0) {
      s->img_buffer = s->img_buffer_end;
      return;
   }
   if (s->io.read) {
      int blen = (int) (s->img_buffer_end - s->img_buffer);
      if (blen < n) {
         s->img_buffer = s->img_buffer_end;
         (s->io.skip)(s->io_user_data, n - blen);
         return;
      }
   }
   s->img_buffer += n;
}